

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

string * __thiscall
CLIntercept::getShortKernelNameWithHash_abi_cxx11_(CLIntercept *this,cl_kernel kernel)

{
  SConfig *pSVar1;
  mapped_type *pmVar2;
  CLIntercept *in_RSI;
  string *in_RDI;
  char hashString [256];
  SKernelInfo *kernelInfo;
  string *name;
  char local_138 [16];
  key_type *in_stack_fffffffffffffed8;
  cl_kernel in_stack_fffffffffffffee0;
  CLIntercept *in_stack_fffffffffffffee8;
  
  getShortKernelName_abi_cxx11_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  pSVar1 = config(in_RSI);
  if ((pSVar1->KernelNameHashTracking & 1U) != 0) {
    pmVar2 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[]((map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
                           *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    memset(local_138,0,0x100);
    pSVar1 = config(in_RSI);
    if ((pSVar1->OmitProgramNumber & 1U) == 0) {
      snprintf(local_138,0x100,"$%04u_%08X_%04u_%08X",(ulong)pmVar2->ProgramNumber,
               pmVar2->ProgramHash & 0xffffffff,(ulong)pmVar2->CompileCount,(int)pmVar2->OptionsHash
              );
    }
    else {
      snprintf(local_138,0x100,"$%08X_%04u_%08X",pmVar2->ProgramHash & 0xffffffff,
               (ulong)pmVar2->CompileCount,pmVar2->OptionsHash & 0xffffffff);
    }
    std::__cxx11::string::operator+=(in_RDI,local_138);
  }
  return in_RDI;
}

Assistant:

inline std::string CLIntercept::getShortKernelNameWithHash(
    const cl_kernel kernel )
{
    std::string name = getShortKernelName( kernel );

    if( config().KernelNameHashTracking )
    {
        const SKernelInfo& kernelInfo = m_KernelInfoMap[ kernel ];

        char    hashString[256] = "";
        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( hashString, 256, "$%08X_%04u_%08X",
                (unsigned int)kernelInfo.ProgramHash,
                kernelInfo.CompileCount,
                (unsigned int)kernelInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( hashString, 256, "$%04u_%08X_%04u_%08X",
                kernelInfo.ProgramNumber,
                (unsigned int)kernelInfo.ProgramHash,
                kernelInfo.CompileCount,
                (unsigned int)kernelInfo.OptionsHash );
        }

        name += hashString;
    }

    return name;
}